

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall
QAbstractSpinBoxPrivate::setValue
          (QAbstractSpinBoxPrivate *this,QVariant *val,EmitPolicy ep,bool doUpdate)

{
  bool bVar1;
  QAbstractSpinBox *this_00;
  byte in_CL;
  int in_EDX;
  QWidget *in_RSI;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBox *q;
  QVariant old;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_28,(QVariant *)&in_RDI->value);
  ::QVariant::QVariant((QVariant *)0x6855a5);
  (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0xb8))(&local_48,in_RDI,in_RSI,&local_68,0);
  ::QVariant::operator=((QVariant *)this_00,(QVariant *)in_RDI);
  ::QVariant::~QVariant(&local_48);
  ::QVariant::~QVariant(&local_68);
  *(ushort *)&in_RDI->field_0x3d0 = *(ushort *)&in_RDI->field_0x3d0 & 0xfffe;
  *(ushort *)&in_RDI->field_0x3d0 = *(ushort *)&in_RDI->field_0x3d0 & 0xff7f;
  if ((in_CL & 1) != 0) {
    (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0xc0))();
  }
  QWidget::update(in_RSI);
  if ((in_EDX == 1) ||
     ((in_EDX == 0 && (bVar1 = ::operator!=((QVariant *)in_RDI,(QVariant *)in_RSI), bVar1)))) {
    (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 200))(in_RDI,in_EDX,&local_28);
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBoxPrivate::setValue(const QVariant &val, EmitPolicy ep,
                                       bool doUpdate)
{
    Q_Q(QAbstractSpinBox);
    const QVariant old = value;
    value = bound(val);
    pendingEmit = false;
    cleared = false;
    if (doUpdate) {
        updateEdit();
    }
    q->update();

    if (ep == AlwaysEmit || (ep == EmitIfChanged && old != value)) {
        emitSignals(ep, old);
    }
}